

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ryml_all.hpp
# Opt level: O3

csubstr __thiscall c4::yml::Parser::_filter_squot_scalar(Parser *this,substr s)

{
  byte bVar1;
  code *pcVar2;
  Location LVar3;
  Location LVar4;
  bool bVar5;
  bool bVar6;
  ulong uVar7;
  ulong uVar8;
  size_t num_characters;
  csubstr cVar9;
  size_t pos;
  char msg [42];
  size_t local_c0;
  size_t local_b8;
  undefined7 uStack_b0;
  undefined1 uStack_a9;
  undefined7 uStack_a8;
  undefined1 uStack_a1;
  undefined2 uStack_a0;
  undefined5 local_9e;
  undefined1 uStack_99;
  undefined2 uStack_98;
  char acStack_96 [22];
  undefined8 local_80;
  undefined8 uStack_78;
  undefined8 local_70;
  char *pcStack_68;
  undefined8 local_60;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  char *pcStack_40;
  undefined8 local_38;
  
  uVar8 = s.len;
  uVar7 = (this->m_filter_arena).len;
  if (uVar7 < uVar8) {
    uVar7 = uVar7 * 2;
    if (uVar7 <= uVar8) {
      uVar7 = uVar8;
    }
    num_characters = 0x80;
    if (0x80 < uVar7) {
      num_characters = uVar7;
    }
    _resize_filter_arena(this,num_characters);
  }
  else {
    local_c0 = 0;
    local_b8 = 0;
    if (uVar8 == 0) {
      bVar6 = false;
      goto LAB_0022a5ee;
    }
  }
  local_b8 = 0;
  local_c0 = 0;
  bVar6 = false;
  do {
    bVar1 = s.str[local_b8];
    if (bVar1 < 0xd) {
      if (bVar1 == 9) {
LAB_0022a4ab:
        _filter_ws<true>(this,s,&local_b8,&local_c0);
      }
      else if (bVar1 == 10) {
        bVar6 = _filter_nl<false,true>(this,s,&local_b8,&local_c0,0);
      }
      else {
LAB_0022a4f2:
        (this->m_filter_arena).str[local_c0] = bVar1;
        local_c0 = local_c0 + 1;
      }
    }
    else if (bVar1 != 0xd) {
      if (bVar1 != 0x27) {
        if (bVar1 != 0x20) goto LAB_0022a4f2;
        goto LAB_0022a4ab;
      }
      if ((local_b8 + 1 < uVar8) && (s.str[local_b8 + 1] == '\'')) {
        (this->m_filter_arena).str[local_c0] = '\'';
        local_b8 = local_b8 + 1;
        bVar6 = true;
        local_c0 = local_c0 + 1;
      }
    }
    local_b8 = local_b8 + 1;
  } while (local_b8 < uVar8);
  if ((this->m_filter_arena).len < local_c0) {
    uStack_98 = 0x6572;
    builtin_strncpy(acStack_96,"na.len)",8);
    uStack_a8 = 0x6d203d3c20736f;
    uStack_a1 = 0x5f;
    uStack_a0 = 0x6966;
    local_9e = 0x5f7265746c;
    uStack_99 = 0x61;
    local_b8._0_1_ = 'c';
    local_b8._1_1_ = 'h';
    local_b8._2_1_ = 'e';
    local_b8._3_1_ = 'c';
    local_b8._4_1_ = 'k';
    local_b8._5_1_ = ' ';
    local_b8._6_1_ = 'f';
    local_b8._7_1_ = 'a';
    uStack_b0 = 0x28203a64656c69;
    uStack_a9 = 0x70;
    if ((((byte)s_error_flags & 1) != 0) && (bVar5 = is_debugger_attached(), bVar5)) {
      pcVar2 = (code *)swi(3);
      cVar9 = (csubstr)(*pcVar2)();
      return cVar9;
    }
    local_58 = 0;
    uStack_50 = 0x7c78;
    local_48 = 0;
    pcStack_40 = 
    "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
    ;
    local_38 = 0x65;
    LVar3.super_LineCol.col = 0;
    LVar3.super_LineCol.offset = SUB168(ZEXT816(0x7c78) << 0x40,0);
    LVar3.super_LineCol.line = SUB168(ZEXT816(0x7c78) << 0x40,8);
    LVar3.name.str =
         "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
    ;
    LVar3.name.len = 0x65;
    (*(this->m_stack).m_callbacks.m_error)
              ((char *)&local_b8,0x2a,LVar3,(this->m_stack).m_callbacks.m_user_data);
  }
LAB_0022a5ee:
  if (((local_c0 < uVar8) || (bVar6 != false)) &&
     (s = _finish_filter_arena(this,s,local_c0), uVar8 < s.len)) {
    uStack_a8 = 0x3d3e206e656c2e;
    uStack_a1 = 0x20;
    uStack_a0 = 0x2e72;
    local_9e = 0x296e656c;
    local_b8._0_1_ = 'c';
    local_b8._1_1_ = 'h';
    local_b8._2_1_ = 'e';
    local_b8._3_1_ = 'c';
    local_b8._4_1_ = 'k';
    local_b8._5_1_ = ' ';
    local_b8._6_1_ = 'f';
    local_b8._7_1_ = 'a';
    uStack_b0 = 0x28203a64656c69;
    uStack_a9 = 0x73;
    if ((((byte)s_error_flags & 1) != 0) && (bVar6 = is_debugger_attached(), bVar6)) {
      pcVar2 = (code *)swi(3);
      cVar9 = (csubstr)(*pcVar2)();
      return cVar9;
    }
    local_80 = 0;
    uStack_78 = 0x7c7e;
    local_70 = 0;
    pcStack_68 = 
    "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
    ;
    local_60 = 0x65;
    LVar4.super_LineCol.col = 0;
    LVar4.super_LineCol.offset = SUB168(ZEXT816(0x7c7e) << 0x40,0);
    LVar4.super_LineCol.line = SUB168(ZEXT816(0x7c7e) << 0x40,8);
    LVar4.name.str =
         "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
    ;
    LVar4.name.len = 0x65;
    (*(this->m_stack).m_callbacks.m_error)
              ((char *)&local_b8,0x1f,LVar4,(this->m_stack).m_callbacks.m_user_data);
  }
  cVar9.str = s.str;
  cVar9.len = s.len;
  return cVar9;
}

Assistant:

csubstr Parser::_filter_squot_scalar(substr s)
{
    // a debugging scaffold:
    #if 0
    #define _c4dbgfsq(...) _c4dbgpf("filt_squo_scalar")
    #else
    #define _c4dbgfsq(...)
    #endif

    // from the YAML spec for double-quoted scalars:
    // https://yaml.org/spec/1.2-old/spec.html#style/flow/single-quoted

    _c4dbgfsq(": before=~~~{}~~~", s);

    _grow_filter_arena(s.len);
    substr r = s;
    size_t pos = 0; // the filtered size
    bool filtered_chars = false;
    for(size_t i = 0; i < r.len; ++i)
    {
        const char curr = r[i];
        _c4dbgfsq("[{}]: '{}'", i, _c4prc(curr));
        if(curr == ' ' || curr == '\t')
        {
            _filter_ws</*keep_trailing_ws*/true>(r, &i, &pos);
        }
        else if(curr == '\n')
        {
            filtered_chars = _filter_nl</*backslash_is_escape*/false, /*keep_trailing_ws*/true>(r, &i, &pos, /*indentation*/0);
        }
        else if(curr == '\r')  // skip \r --- https://stackoverflow.com/questions/1885900
        {
            ;
        }
        else if(curr == '\'')
        {
            char next = i+1 < r.len ? r[i+1] : '\0';
            if(next == '\'')
            {
                _c4dbgfsq("[{}]: two consecutive quotes", i);
                filtered_chars = true;
                m_filter_arena.str[pos++] = '\'';
                ++i;
            }
        }
        else
        {
            m_filter_arena.str[pos++] = curr;
        }
    }

    _RYML_CB_ASSERT(m_stack.m_callbacks, pos <= m_filter_arena.len);
    if(pos < r.len || filtered_chars)
    {
        r = _finish_filter_arena(r, pos);
    }

    _RYML_CB_ASSERT(m_stack.m_callbacks, s.len >= r.len);
    _c4dbgpf(": #filteredchars={} after=~~~{}~~~", s.len - r.len, r);

    #undef _c4dbgfsq
    return r;
}